

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O0

FT_Error ps_hints_close(PS_Hints hints,FT_UInt end_point)

{
  FT_Memory memory_00;
  PS_Dimension dim;
  FT_Memory memory;
  FT_Error error;
  FT_UInt end_point_local;
  PS_Hints hints_local;
  
  memory._0_4_ = hints->error;
  if ((int)memory == 0) {
    memory_00 = hints->memory;
    memory._0_4_ = ps_dimension_end(hints->dimension,end_point,memory_00);
    if ((int)memory == 0) {
      memory._0_4_ = ps_dimension_end(hints->dimension + 1,end_point,memory_00);
    }
  }
  return (int)memory;
}

Assistant:

static FT_Error
  ps_hints_close( PS_Hints  hints,
                  FT_UInt   end_point )
  {
    FT_Error  error;


    error = hints->error;
    if ( !error )
    {
      FT_Memory     memory = hints->memory;
      PS_Dimension  dim    = hints->dimension;


      error = ps_dimension_end( &dim[0], end_point, memory );
      if ( !error )
      {
        error = ps_dimension_end( &dim[1], end_point, memory );
      }
    }

#ifdef DEBUG_HINTER
    if ( !error )
      ps_debug_hints = hints;
#endif
    return error;
  }